

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O0

bool Imath_3_2::extractSHRT<float>
               (Matrix33<float> *mat,Vec2<float> *s,float *h,float *r,Vec2<float> *t,bool exc)

{
  byte bVar1;
  bool bVar2;
  float *pfVar3;
  Matrix33<float> *in_RDI;
  Matrix33<float> *in_R8;
  byte in_R9B;
  Matrix33<float> rot;
  undefined7 in_stack_ffffffffffffffc8;
  
  bVar1 = in_R9B & 1;
  Matrix33<float>::Matrix33((Matrix33<float> *)&stack0xffffffffffffffa8);
  Matrix33<float>::operator=((Matrix33<float> *)&stack0xffffffffffffffa8,in_RDI);
  bVar2 = extractAndRemoveScalingAndShear<float>
                    ((Matrix33<float> *)t,(Vec2<float> *)CONCAT17(exc,stack0x00000020),
                     (float *)rot.x[2]._0_8_,rot.x[1][2]._3_1_);
  if (bVar2) {
    extractEuler<float>(in_R8,(float *)CONCAT17(bVar1,in_stack_ffffffffffffffc8));
    pfVar3 = Matrix33<float>::operator[](in_RDI,2);
    in_R8->x[0][0] = *pfVar3;
    pfVar3 = Matrix33<float>::operator[](in_RDI,2);
    in_R8->x[0][1] = pfVar3[1];
  }
  return bVar2;
}

Assistant:

bool
extractSHRT (
    const Matrix33<T>& mat, Vec2<T>& s, T& h, T& r, Vec2<T>& t, bool exc)
{
    Matrix33<T> rot;

    rot = mat;
    if (!extractAndRemoveScalingAndShear (rot, s, h, exc)) return false;

    extractEuler (rot, r);

    t.x = mat[2][0];
    t.y = mat[2][1];

    return true;
}